

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall
duckdb::DBConfig::DBConfig(DBConfig *this,case_insensitive_map_t<Value> *config_dict,bool read_only)

{
  DBConfig(this,read_only);
  SetOptionsByName(this,config_dict);
  return;
}

Assistant:

DBConfig::DBConfig(const case_insensitive_map_t<Value> &config_dict, bool read_only) : DBConfig::DBConfig(read_only) {
	SetOptionsByName(config_dict);
}